

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

int lua_pcallk(lua_State *L,int nargs,int nresults,int errfunc,lua_KContext ctx,lua_KFunction k)

{
  byte *pbVar1;
  CallInfo *pCVar2;
  byte bVar3;
  uint uVar4;
  ptrdiff_t ef;
  CallS c;
  StkId local_28;
  int local_20;
  StkId pSVar5;
  
  if (errfunc == 0) {
    ef = 0;
  }
  else {
    if (errfunc < 1) {
      pSVar5 = (L->top).p + errfunc;
    }
    else {
      pSVar5 = (L->ci->func).p + (uint)errfunc;
    }
    ef = (long)pSVar5 - (L->stack).offset;
  }
  local_28 = (L->top).p + ~nargs;
  if ((k == (lua_KFunction)0x0) || (0xffff < L->nCcalls)) {
    local_20 = nresults;
    bVar3 = luaD_pcall(L,f_call,&local_28,(long)local_28 - (L->stack).offset,ef);
    uVar4 = (uint)bVar3;
  }
  else {
    pCVar2 = L->ci;
    (pCVar2->u).c.k = k;
    (pCVar2->u).c.ctx = ctx;
    (pCVar2->u2).funcidx = (int)local_28 - *(int *)&L->stack;
    (pCVar2->u).c.old_errfunc = L->errfunc;
    L->errfunc = ef;
    pCVar2->callstatus =
         (uint)(L->allowhook != '\0') * 0x80000 + (pCVar2->callstatus & 0xffd7ffff) + 0x200000;
    luaD_call(L,local_28,nresults);
    pbVar1 = (byte *)((long)&pCVar2->callstatus + 2);
    *pbVar1 = *pbVar1 & 0xdf;
    L->errfunc = (pCVar2->u).c.old_errfunc;
    uVar4 = 0;
  }
  if (nresults < 0) {
    if ((L->ci->top).p < (L->top).p) {
      (L->ci->top).p = (L->top).p;
    }
  }
  return uVar4;
}

Assistant:

LUA_API int lua_pcallk (lua_State *L, int nargs, int nresults, int errfunc,
                        lua_KContext ctx, lua_KFunction k) {
  struct CallS c;
  TStatus status;
  ptrdiff_t func;
  lua_lock(L);
  api_check(L, k == NULL || !isLua(L->ci),
    "cannot use continuations inside hooks");
  api_checkpop(L, nargs + 1);
  api_check(L, L->status == LUA_OK, "cannot do calls on non-normal thread");
  checkresults(L, nargs, nresults);
  if (errfunc == 0)
    func = 0;
  else {
    StkId o = index2stack(L, errfunc);
    api_check(L, ttisfunction(s2v(o)), "error handler must be a function");
    func = savestack(L, o);
  }
  c.func = L->top.p - (nargs+1);  /* function to be called */
  if (k == NULL || !yieldable(L)) {  /* no continuation or no yieldable? */
    c.nresults = nresults;  /* do a 'conventional' protected call */
    status = luaD_pcall(L, f_call, &c, savestack(L, c.func), func);
  }
  else {  /* prepare continuation (call is already protected by 'resume') */
    CallInfo *ci = L->ci;
    ci->u.c.k = k;  /* save continuation */
    ci->u.c.ctx = ctx;  /* save context */
    /* save information for error recovery */
    ci->u2.funcidx = cast_int(savestack(L, c.func));
    ci->u.c.old_errfunc = L->errfunc;
    L->errfunc = func;
    setoah(ci, L->allowhook);  /* save value of 'allowhook' */
    ci->callstatus |= CIST_YPCALL;  /* function can do error recovery */
    luaD_call(L, c.func, nresults);  /* do the call */
    ci->callstatus &= ~CIST_YPCALL;
    L->errfunc = ci->u.c.old_errfunc;
    status = LUA_OK;  /* if it is here, there were no errors */
  }
  adjustresults(L, nresults);
  lua_unlock(L);
  return APIstatus(status);
}